

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  long lVar1;
  int iVar2;
  int in_EDX;
  sqlite3_value *in_RSI;
  sqlite3_context *in_RDI;
  int iLangid;
  Fts3Table *p;
  Fts3Cursor *pCsr;
  int rc;
  _func_void_void_ptr *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int iVar3;
  Mem *pContext;
  int local_18;
  
  local_18 = 0;
  pContext = in_RDI->pOut;
  if (in_EDX == *(int *)&pContext->xDel + 1) {
    sqlite3_result_int64
              ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (i64)in_stack_ffffffffffffffc8);
  }
  else if (in_EDX == *(int *)&pContext->xDel) {
    sqlite3_result_blob(in_RDI,pContext,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  }
  else if ((in_EDX == *(int *)&pContext->xDel + 2) && (in_RDI->pVdbe != (Vdbe *)0x0)) {
    sqlite3_result_int64
              ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (i64)in_stack_ffffffffffffffc8);
  }
  else {
    local_18 = fts3CursorSeek((sqlite3_context *)pContext,
                              (Fts3Cursor *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (local_18 == 0) {
      if (in_EDX == *(int *)&pContext->xDel + 2) {
        iVar3 = 0;
        lVar1._0_4_ = pContext[1].szMalloc;
        lVar1._4_4_ = pContext[1].uTemp;
        if (lVar1 != 0) {
          iVar3 = sqlite3_column_int((sqlite3_stmt *)(ulong)in_stack_ffffffffffffffd0,iVar2);
        }
        sqlite3_result_int((sqlite3_context *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),iVar2);
      }
      else {
        iVar2 = sqlite3_data_count((sqlite3_stmt *)in_RDI->pMem);
        if (in_EDX + 1 < iVar2) {
          sqlite3_column_value
                    ((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (int)((ulong)in_RSI >> 0x20));
          sqlite3_result_value
                    ((sqlite3_context *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RSI);
        }
      }
    }
  }
  return local_18;
}

Assistant:

static int fts3ColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  int rc = SQLITE_OK;             /* Return Code */
  Fts3Cursor *pCsr = (Fts3Cursor *) pCursor;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;

  /* The column value supplied by SQLite must be in range. */
  assert( iCol>=0 && iCol<=p->nColumn+2 );

  if( iCol==p->nColumn+1 ){
    /* This call is a request for the "docid" column. Since "docid" is an 
    ** alias for "rowid", use the xRowid() method to obtain the value.
    */
    sqlite3_result_int64(pCtx, pCsr->iPrevId);
  }else if( iCol==p->nColumn ){
    /* The extra column whose name is the same as the table.
    ** Return a blob which is a pointer to the cursor.  */
    sqlite3_result_blob(pCtx, &pCsr, sizeof(pCsr), SQLITE_TRANSIENT);
  }else if( iCol==p->nColumn+2 && pCsr->pExpr ){
    sqlite3_result_int64(pCtx, pCsr->iLangid);
  }else{
    /* The requested column is either a user column (one that contains 
    ** indexed data), or the language-id column.  */
    rc = fts3CursorSeek(0, pCsr);

    if( rc==SQLITE_OK ){
      if( iCol==p->nColumn+2 ){
        int iLangid = 0;
        if( p->zLanguageid ){
          iLangid = sqlite3_column_int(pCsr->pStmt, p->nColumn+1);
        }
        sqlite3_result_int(pCtx, iLangid);
      }else if( sqlite3_data_count(pCsr->pStmt)>(iCol+1) ){
        sqlite3_result_value(pCtx, sqlite3_column_value(pCsr->pStmt, iCol+1));
      }
    }
  }

  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}